

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::TableBox::TableBox(TableBox *this,TableBox *other)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  undefined4 extraout_var;
  reference this_00;
  reference pvVar4;
  int local_20;
  int local_1c;
  int j;
  int i;
  TableBox *other_local;
  TableBox *this_local;
  
  TableBox(this,other->rows_,other->cols_);
  for (local_1c = 0; local_1c < this->rows_; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->cols_; local_20 = local_20 + 1) {
      pvVar2 = std::
               vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
               ::operator[](&other->table_,(long)local_1c);
      pvVar3 = std::
               vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
               ::operator[](pvVar2,(long)local_20);
      if (pvVar3->first != (Box *)0x0) {
        pvVar2 = std::
                 vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                 ::operator[](&other->table_,(long)local_1c);
        pvVar3 = std::
                 vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 ::operator[](pvVar2,(long)local_20);
        iVar1 = (*pvVar3->first->_vptr_Box[2])();
        this_00 = std::
                  vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                  ::operator[](&this->table_,(long)local_1c);
        pvVar4 = std::
                 vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 ::operator[](this_00,(long)local_20);
        pvVar4->first = (Box *)CONCAT44(extraout_var,iVar1);
      }
    }
  }
  return;
}

Assistant:

TableBox::TableBox(const TableBox &other) : TableBox(other.rows_, other.cols_) {
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            if (other.table_[i][j].first) {
                table_[i][j].first = other.table_[i][j].first->clone();
            }
        }
    }
}